

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  char cVar3;
  uchar uVar4;
  undefined1 uVar5;
  short sVar6;
  ushort uVar7;
  undefined8 uVar8;
  long lVar9;
  short sVar10;
  bool bVar11;
  byte bVar12;
  byte bVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  stbi__uint32 sVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  stbi__uint32 sVar24;
  stbi__uint32 sVar25;
  int iVar26;
  int iVar27;
  stbi__jpeg *psVar28;
  long lVar29;
  uchar *puVar30;
  stbi_uc *psVar31;
  void *pvVar32;
  code *pcVar33;
  stbi__context *data_00;
  undefined8 *puVar34;
  stbi_uc *psVar35;
  stbi__uint16 *data_01;
  ulong uVar36;
  undefined8 *puVar37;
  undefined1 *puVar38;
  short sVar39;
  short *psVar40;
  int id;
  uint uVar41;
  ulong uVar42;
  stbi__context *psVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  ulong uVar47;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar48;
  stbi__result_info *ri_00;
  stbi__jpeg *psVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  byte *pbVar54;
  int iVar55;
  uint uVar56;
  stbi_uc **ppsVar57;
  uint uVar58;
  ulong uVar59;
  stbi_uc *psVar60;
  stbi__uint16 *psVar61;
  bool bVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  stbi__uint16 *local_8978;
  stbi_uc *local_8958;
  uint local_8948;
  uint local_88ec;
  stbi_uc *coutput [4];
  int local_88b8;
  int local_88b4;
  int local_88b0;
  short data [64];
  
  psVar35 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar28 = (stbi__jpeg *)malloc(0x4888);
  psVar28->s = s;
  psVar28->idct_block_kernel = stbi__idct_simd;
  psVar28->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar28->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar19 = stbi__decode_jpeg_header(psVar28,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar28);
  if (iVar19 != 0) {
    psVar28 = (stbi__jpeg *)malloc(0x4888);
    psVar28->s = s;
    psVar28->idct_block_kernel = stbi__idct_simd;
    psVar28->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar28->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar29 = 0x46d8; lVar29 != 0x4858; lVar29 = lVar29 + 0x60) {
        psVar35 = psVar28->huff_dc[0].fast + lVar29 + -8;
        psVar35[0] = '\0';
        psVar35[1] = '\0';
        psVar35[2] = '\0';
        psVar35[3] = '\0';
        psVar35[4] = '\0';
        psVar35[5] = '\0';
        psVar35[6] = '\0';
        psVar35[7] = '\0';
        psVar35[8] = '\0';
        psVar35[9] = '\0';
        psVar35[10] = '\0';
        psVar35[0xb] = '\0';
        psVar35[0xc] = '\0';
        psVar35[0xd] = '\0';
        psVar35[0xe] = '\0';
        psVar35[0xf] = '\0';
      }
      psVar28->restart_interval = 0;
      iVar19 = stbi__decode_jpeg_header(psVar28,0);
      if (iVar19 != 0) {
        paVar1 = psVar28->img_comp;
        bVar12 = stbi__get_marker(psVar28);
LAB_00128da5:
        if (bVar12 == 0xda) {
          iVar19 = stbi__get16be(psVar28->s);
          bVar12 = stbi__get8(psVar28->s);
          uVar51 = (uint)bVar12;
          psVar28->scan_n = (uint)bVar12;
          if (((byte)(bVar12 - 5) < 0xfc) ||
             (psVar43 = psVar28->s, psVar43->img_n < (int)(uint)bVar12)) {
            stbi__g_failure_reason = "bad SOS component count";
          }
          else if (iVar19 == (uint)bVar12 * 2 + 6) {
            lVar29 = 0;
            while( true ) {
              bVar12 = stbi__get8(psVar43);
              if ((int)uVar51 <= lVar29) break;
              bVar13 = stbi__get8(psVar28->s);
              psVar43 = psVar28->s;
              uVar51 = psVar43->img_n;
              uVar36 = 0;
              if (0 < (int)uVar51) {
                uVar36 = (ulong)uVar51;
              }
              paVar48 = paVar1;
              for (uVar59 = 0; uVar36 != uVar59; uVar59 = uVar59 + 1) {
                if (paVar48->id == (uint)bVar12) {
                  uVar36 = uVar59 & 0xffffffff;
                  break;
                }
                paVar48 = paVar48 + 1;
              }
              if ((uint)uVar36 == uVar51) goto LAB_0012a4f8;
              psVar28->img_comp[uVar36].hd = (uint)(bVar13 >> 4);
              if (0x3f < bVar13) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_0012a4f8;
              }
              paVar1[uVar36].ha = bVar13 & 0xf;
              if (3 < (bVar13 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_0012a4f8;
              }
              psVar28->order[lVar29] = (uint)uVar36;
              lVar29 = lVar29 + 1;
              uVar51 = psVar28->scan_n;
            }
            psVar28->spec_start = (uint)bVar12;
            bVar12 = stbi__get8(psVar28->s);
            psVar28->spec_end = (uint)bVar12;
            bVar12 = stbi__get8(psVar28->s);
            psVar28->succ_high = (uint)(bVar12 >> 4);
            psVar28->succ_low = bVar12 & 0xf;
            iVar19 = psVar28->spec_start;
            if (psVar28->progressive == 0) {
              if (((iVar19 == 0) && (bVar12 < 0x10)) && ((bVar12 & 0xf) == 0)) {
                psVar28->spec_end = 0x3f;
                goto LAB_00128fa6;
              }
            }
            else if (((iVar19 < 0x40) && (psVar28->spec_end < 0x40)) &&
                    ((iVar19 <= psVar28->spec_end && ((bVar12 < 0xe0 && ((bVar12 & 0xf) < 0xe))))))
            {
LAB_00128fa6:
              stbi__jpeg_reset(psVar28);
              if (psVar28->progressive == 0) {
                if (psVar28->scan_n == 1) {
                  iVar19 = psVar28->order[0];
                  uVar51 = psVar28->img_comp[iVar19].x + 7 >> 3;
                  iVar27 = psVar28->img_comp[iVar19].y + 7 >> 3;
                  if ((int)uVar51 < 1) {
                    uVar51 = 0;
                  }
                  iVar50 = 0;
                  if (iVar27 < 1) {
                    iVar27 = 0;
                  }
                  for (iVar44 = 0; iVar44 != iVar27; iVar44 = iVar44 + 1) {
                    for (lVar29 = 0; (ulong)uVar51 * 8 != lVar29; lVar29 = lVar29 + 8) {
                      iVar45 = stbi__jpeg_decode_block
                                         (psVar28,data,
                                          (stbi__huffman *)psVar28->huff_dc[paVar1[iVar19].hd].fast,
                                          (stbi__huffman *)psVar28->huff_ac[paVar1[iVar19].ha].fast,
                                          psVar28->fast_ac[paVar1[iVar19].ha],iVar19,
                                          psVar28->dequant[paVar1[iVar19].tq]);
                      if (iVar45 == 0) {
                        bVar62 = false;
                        goto LAB_00129838;
                      }
                      (*psVar28->idct_block_kernel)
                                (paVar1[iVar19].data + lVar29 + iVar50 * paVar1[iVar19].w2,
                                 paVar1[iVar19].w2,data);
                      iVar45 = psVar28->todo;
                      psVar28->todo = iVar45 + -1;
                      if (iVar45 < 2) {
                        if (psVar28->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar28);
                        }
                        if ((psVar28->marker & 0xf8) != 0xd0) goto LAB_00129835;
                        stbi__jpeg_reset(psVar28);
                      }
                    }
                    iVar50 = iVar50 + 8;
                  }
                }
                else {
                  for (iVar19 = 0; iVar19 < psVar28->img_mcu_y; iVar19 = iVar19 + 1) {
                    for (iVar27 = 0; iVar27 < psVar28->img_mcu_x; iVar27 = iVar27 + 1) {
                      for (lVar29 = 0; lVar29 < psVar28->scan_n; lVar29 = lVar29 + 1) {
                        iVar50 = psVar28->order[lVar29];
                        for (iVar44 = 0; iVar44 < paVar1[iVar50].v; iVar44 = iVar44 + 1) {
                          for (iVar45 = 0; iVar21 = paVar1[iVar50].h, iVar45 < iVar21;
                              iVar45 = iVar45 + 1) {
                            iVar22 = paVar1[iVar50].v;
                            iVar23 = stbi__jpeg_decode_block
                                               (psVar28,data,
                                                (stbi__huffman *)
                                                psVar28->huff_dc[paVar1[iVar50].hd].fast,
                                                (stbi__huffman *)
                                                psVar28->huff_ac[paVar1[iVar50].ha].fast,
                                                psVar28->fast_ac[paVar1[iVar50].ha],iVar50,
                                                psVar28->dequant[paVar1[iVar50].tq]);
                            if (iVar23 == 0) {
                              bVar62 = false;
                              goto LAB_00129838;
                            }
                            (*psVar28->idct_block_kernel)
                                      (paVar1[iVar50].data +
                                       (long)((iVar21 * iVar27 + iVar45) * 8) +
                                       (long)((iVar22 * iVar19 + iVar44) * paVar1[iVar50].w2 * 8),
                                       paVar1[iVar50].w2,data);
                          }
                        }
                      }
                      iVar50 = psVar28->todo;
                      psVar28->todo = iVar50 + -1;
                      if (iVar50 < 2) {
                        if (psVar28->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar28);
                        }
                        if ((psVar28->marker & 0xf8) != 0xd0) goto LAB_00129835;
                        stbi__jpeg_reset(psVar28);
                      }
                    }
                  }
                }
LAB_00129835:
                bVar62 = true;
LAB_00129838:
                if (!bVar62) goto LAB_0012a4f8;
              }
              else if (psVar28->scan_n == 1) {
                iVar19 = psVar28->order[0];
                iVar27 = psVar28->img_comp[iVar19].x + 7 >> 3;
                iVar50 = psVar28->img_comp[iVar19].y + 7 >> 3;
                iVar44 = 0;
                if (iVar27 < 1) {
                  iVar27 = iVar44;
                }
                if (iVar50 < 1) {
                  iVar50 = iVar44;
                }
                for (; iVar44 != iVar50; iVar44 = iVar44 + 1) {
                  for (iVar45 = 0; iVar45 != iVar27; iVar45 = iVar45 + 1) {
                    psVar40 = paVar1[iVar19].coeff +
                              (paVar1[iVar19].coeff_w * iVar44 + iVar45) * 0x40;
                    uVar36 = (ulong)psVar28->spec_start;
                    if (uVar36 == 0) {
                      iVar21 = stbi__jpeg_decode_block_prog_dc
                                         (psVar28,psVar40,
                                          (stbi__huffman *)psVar28->huff_dc[paVar1[iVar19].hd].fast,
                                          iVar19);
                      if (iVar21 == 0) goto LAB_0012a4f8;
                    }
                    else {
                      iVar21 = paVar1[iVar19].ha;
                      psVar35 = psVar28->huff_ac[iVar21].fast;
                      iVar22 = psVar28->eob_run;
                      bVar12 = (byte)psVar28->succ_low;
                      if (psVar28->succ_high == 0) {
                        if (iVar22 == 0) {
                          do {
                            if (psVar28->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar28);
                            }
                            sVar39 = psVar28->fast_ac[iVar21][psVar28->code_buffer >> 0x17];
                            uVar51 = (uint)sVar39;
                            iVar22 = (int)uVar36;
                            if (sVar39 == 0) {
                              uVar51 = stbi__jpeg_huff_decode(psVar28,(stbi__huffman *)psVar35);
                              if ((int)uVar51 < 0) goto LAB_00129e5e;
                              uVar41 = uVar51 >> 4;
                              if ((uVar51 & 0xf) == 0) {
                                if (uVar51 < 0xf0) {
                                  iVar22 = 1 << ((byte)uVar41 & 0x1f);
                                  psVar28->eob_run = iVar22;
                                  if (0xf < uVar51) {
                                    iVar22 = stbi__jpeg_get_bits(psVar28,uVar41);
                                    iVar22 = iVar22 + psVar28->eob_run;
                                  }
                                  goto LAB_0012914d;
                                }
                                uVar36 = (ulong)(iVar22 + 0x10);
                              }
                              else {
                                lVar29 = (ulong)uVar41 + (long)iVar22;
                                uVar36 = (ulong)((int)lVar29 + 1);
                                bVar13 = ""[lVar29];
                                iVar22 = stbi__extend_receive(psVar28,uVar51 & 0xf);
                                psVar40[bVar13] = (short)(iVar22 << (bVar12 & 0x1f));
                              }
                            }
                            else {
                              lVar29 = (ulong)(uVar51 >> 4 & 0xf) + (long)iVar22;
                              psVar28->code_buffer = psVar28->code_buffer << (sbyte)(uVar51 & 0xf);
                              psVar28->code_bits = psVar28->code_bits - (uVar51 & 0xf);
                              uVar36 = (ulong)((int)lVar29 + 1);
                              psVar40[""[lVar29]] = (short)((uVar51 >> 8) << (bVar12 & 0x1f));
                            }
                          } while ((int)uVar36 <= psVar28->spec_end);
                        }
                        else {
LAB_0012914d:
                          psVar28->eob_run = iVar22 + -1;
                        }
                      }
                      else if (iVar22 == 0) {
                        iVar21 = 0x10000 << (bVar12 & 0x1f);
                        do {
                          uVar51 = stbi__jpeg_huff_decode(psVar28,(stbi__huffman *)psVar35);
                          if ((int)uVar51 < 0) goto LAB_00129e5e;
                          uVar41 = uVar51 >> 4;
                          if ((uVar51 & 0xf) == 1) {
                            iVar22 = stbi__jpeg_get_bit(psVar28);
                            iVar23 = 1;
                            if (iVar22 == 0) {
                              iVar23 = 0xffff;
                            }
                            sVar39 = (short)(iVar23 << (bVar12 & 0x1f));
                          }
                          else {
                            if ((uVar51 & 0xf) != 0) {
                              stbi__g_failure_reason = "bad huffman code";
                              goto LAB_0012a4f8;
                            }
                            if (uVar51 < 0xf0) {
                              psVar28->eob_run = ~(-1 << ((byte)uVar41 & 0x1f));
                              if (0xf < uVar51) {
                                iVar22 = stbi__jpeg_get_bits(psVar28,uVar41);
                                psVar28->eob_run = psVar28->eob_run + iVar22;
                              }
                              uVar41 = 0x40;
                            }
                            else {
                              uVar41 = 0xf;
                            }
                            sVar39 = 0;
                          }
                          uVar59 = (long)(int)uVar36;
                          do {
                            while( true ) {
                              uVar36 = uVar59;
                              iVar22 = psVar28->spec_end;
                              if ((long)iVar22 < (long)uVar36) goto LAB_0012927d;
                              bVar13 = ""[uVar36];
                              if (psVar40[bVar13] == 0) break;
                              iVar22 = stbi__jpeg_get_bit(psVar28);
                              if ((iVar22 != 0) &&
                                 (sVar6 = psVar40[bVar13], (iVar21 >> 0x10 & (int)sVar6) == 0)) {
                                sVar10 = (short)((uint)iVar21 >> 0x10);
                                if (sVar6 < 1) {
                                  sVar10 = -sVar10;
                                }
                                psVar40[bVar13] = sVar6 + sVar10;
                              }
                              uVar59 = uVar36 + 1;
                            }
                            bVar62 = uVar41 != 0;
                            uVar41 = uVar41 - 1;
                            uVar59 = uVar36 + 1;
                          } while (bVar62);
                          psVar40[bVar13] = sVar39;
                          uVar36 = uVar36 + 1;
LAB_0012927d:
                        } while ((int)uVar36 <= iVar22);
                      }
                      else {
                        psVar28->eob_run = iVar22 + -1;
                        uVar51 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                        for (; (long)uVar36 <= (long)psVar28->spec_end; uVar36 = uVar36 + 1) {
                          bVar12 = ""[uVar36];
                          if (((psVar40[bVar12] != 0) &&
                              (iVar21 = stbi__jpeg_get_bit(psVar28), iVar21 != 0)) &&
                             (sVar39 = psVar40[bVar12], (uVar51 & (int)sVar39) == 0)) {
                            uVar41 = -uVar51;
                            if (0 < sVar39) {
                              uVar41 = uVar51;
                            }
                            psVar40[bVar12] = (short)uVar41 + sVar39;
                          }
                        }
                      }
                    }
                    iVar21 = psVar28->todo;
                    psVar28->todo = iVar21 + -1;
                    if (iVar21 < 2) {
                      if (psVar28->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar28);
                      }
                      bVar12 = psVar28->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_00129847;
                      stbi__jpeg_reset(psVar28);
                    }
                  }
                }
              }
              else {
                for (iVar19 = 0; iVar19 < psVar28->img_mcu_y; iVar19 = iVar19 + 1) {
                  for (iVar27 = 0; iVar27 < psVar28->img_mcu_x; iVar27 = iVar27 + 1) {
                    for (lVar29 = 0; lVar29 < psVar28->scan_n; lVar29 = lVar29 + 1) {
                      iVar50 = psVar28->order[lVar29];
                      for (iVar44 = 0; iVar44 < paVar1[iVar50].v; iVar44 = iVar44 + 1) {
                        iVar45 = 0;
                        while (iVar45 < paVar1[iVar50].h) {
                          iVar21 = stbi__jpeg_decode_block_prog_dc
                                             (psVar28,paVar1[iVar50].coeff +
                                                      (paVar1[iVar50].h * iVar27 + iVar45 +
                                                      (paVar1[iVar50].v * iVar19 + iVar44) *
                                                      paVar1[iVar50].coeff_w) * 0x40,
                                              (stbi__huffman *)
                                              psVar28->huff_dc[paVar1[iVar50].hd].fast,iVar50);
                          iVar45 = iVar45 + 1;
                          if (iVar21 == 0) goto LAB_0012a4f8;
                        }
                      }
                    }
                    iVar50 = psVar28->todo;
                    psVar28->todo = iVar50 + -1;
                    if (iVar50 < 2) {
                      if (psVar28->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar28);
                      }
                      bVar12 = psVar28->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_00129847;
                      stbi__jpeg_reset(psVar28);
                    }
                  }
                }
              }
              bVar12 = psVar28->marker;
LAB_00129847:
              if (bVar12 == 0xff) {
                do {
                  iVar19 = stbi__at_eof(psVar28->s);
                  if (iVar19 != 0) goto LAB_00128e08;
                  sVar14 = stbi__get8(psVar28->s);
                } while (sVar14 != 0xff);
                sVar14 = stbi__get8(psVar28->s);
                psVar28->marker = sVar14;
              }
              goto LAB_00128e08;
            }
            stbi__g_failure_reason = "bad SOS";
          }
          else {
            stbi__g_failure_reason = "bad SOS len";
          }
          goto LAB_0012a4f8;
        }
        if (bVar12 == 0xdc) {
          iVar19 = stbi__get16be(psVar28->s);
          sVar20 = stbi__get16be(psVar28->s);
          if (iVar19 == 4) {
            if (sVar20 == psVar28->s->img_y) goto LAB_00128e08;
            stbi__g_failure_reason = "bad DNL height";
          }
          else {
            stbi__g_failure_reason = "bad DNL len";
          }
          goto LAB_0012a4f8;
        }
        if (bVar12 != 0xd9) {
          iVar19 = stbi__process_marker(psVar28,(uint)bVar12);
          if (iVar19 != 0) goto LAB_00128e08;
          goto LAB_0012a4f8;
        }
        if (psVar28->progressive == 0) {
          psVar43 = psVar28->s;
          uVar51 = psVar43->img_n;
        }
        else {
          lVar29 = 0;
          while( true ) {
            psVar43 = psVar28->s;
            uVar51 = psVar43->img_n;
            if ((int)uVar51 <= lVar29) break;
            uVar51 = psVar28->img_comp[lVar29].x + 7 >> 3;
            iVar19 = psVar28->img_comp[lVar29].y + 7 >> 3;
            uVar59 = 0;
            uVar36 = (ulong)uVar51;
            if ((int)uVar51 < 1) {
              uVar36 = uVar59;
            }
            if (iVar19 < 1) {
              iVar19 = 0;
            }
            while (iVar27 = (int)uVar59, iVar27 != iVar19) {
              for (uVar59 = 0; uVar59 != uVar36; uVar59 = uVar59 + 1) {
                psVar40 = paVar1[lVar29].coeff;
                iVar44 = paVar1[lVar29].coeff_w * iVar27;
                iVar50 = paVar1[lVar29].tq;
                iVar45 = iVar44 + (int)uVar59;
                for (lVar46 = 0; lVar46 != 0x40; lVar46 = lVar46 + 1) {
                  psVar40[iVar45 * 0x40 + lVar46] =
                       psVar40[iVar45 * 0x40 + lVar46] * psVar28->dequant[iVar50][lVar46];
                }
                (*psVar28->idct_block_kernel)
                          (paVar1[lVar29].data + uVar59 * 8 + (long)(iVar27 * 8 * paVar1[lVar29].w2)
                           ,paVar1[lVar29].w2,psVar40 + (iVar44 + (int)uVar59) * 0x40);
              }
              uVar59 = (ulong)(iVar27 + 1);
            }
            lVar29 = lVar29 + 1;
          }
        }
        uVar41 = (2 < (int)uVar51) + 1 + (uint)(2 < (int)uVar51);
        if (req_comp != 0) {
          uVar41 = req_comp;
        }
        lVar29 = 0;
        bVar62 = false;
        if ((uVar51 == 3) && (bVar62 = true, psVar28->rgb != 3)) {
          if (psVar28->app14_color_transform == 0) {
            bVar62 = psVar28->jfif == 0;
          }
          else {
            bVar62 = false;
          }
        }
        uVar36 = 0;
        if (0 < (int)uVar51) {
          uVar36 = (ulong)uVar51;
        }
        uVar59 = 1;
        if (bVar62) {
          uVar59 = uVar36;
        }
        if (2 < (int)uVar41) {
          uVar59 = uVar36;
        }
        coutput[2] = (stbi_uc *)0x0;
        coutput[3] = (stbi_uc *)0x0;
        coutput[0] = (stbi_uc *)0x0;
        coutput[1] = (stbi_uc *)0x0;
        if (uVar51 != 3) {
          uVar59 = uVar36;
        }
        do {
          if (uVar59 * 0x30 == lVar29) {
            sVar20 = psVar43->img_y;
            data_00 = (stbi__context *)stbi__malloc_mad3(uVar41,psVar43->img_x,sVar20,1);
            if (data_00 != (stbi__context *)0x0) {
              iVar19 = 0;
              uVar51 = 0;
              do {
                if (sVar20 <= uVar51) {
                  stbi__cleanup_jpeg(psVar28);
                  psVar43 = psVar28->s;
                  *x = psVar43->img_x;
                  *y = psVar43->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar43->img_n) * 2 + 1;
                  }
                  goto LAB_0012a507;
                }
                sVar20 = psVar43->img_x;
                ppsVar57 = coutput;
                for (lVar29 = 0; uVar59 * 0x30 != lVar29; lVar29 = lVar29 + 0x30) {
                  puVar34 = (undefined8 *)((long)data + lVar29 + 0x10);
                  iVar27 = *(int *)((long)data + lVar29 + 0x24);
                  iVar50 = *(int *)((long)data + lVar29 + 0x1c);
                  iVar44 = iVar50 >> 1;
                  puVar2 = (undefined8 *)((long)data + lVar29 + 8);
                  puVar37 = puVar34;
                  if (iVar27 < iVar44) {
                    puVar37 = puVar2;
                  }
                  if (iVar44 <= iVar27) {
                    puVar34 = puVar2;
                  }
                  psVar35 = (stbi_uc *)
                            (**(code **)((long)data + lVar29))
                                      (*(undefined8 *)
                                        ((long)&psVar28->img_comp[0].linebuf + lVar29 * 2),*puVar37,
                                       *puVar34,*(undefined4 *)((long)data + lVar29 + 0x20));
                  *ppsVar57 = psVar35;
                  *(int *)((long)data + lVar29 + 0x24) = iVar27 + 1;
                  if (iVar50 <= iVar27 + 1) {
                    *(undefined4 *)((long)data + lVar29 + 0x24) = 0;
                    lVar46 = *(long *)((long)data + lVar29 + 0x10);
                    *(long *)((long)data + lVar29 + 8) = lVar46;
                    iVar27 = *(int *)((long)data + lVar29 + 0x28) + 1;
                    *(int *)((long)data + lVar29 + 0x28) = iVar27;
                    if (iVar27 < *(int *)((long)&psVar28->img_comp[0].y + lVar29 * 2)) {
                      *(long *)((long)data + lVar29 + 0x10) =
                           lVar46 + *(int *)((long)&psVar28->img_comp[0].w2 + lVar29 * 2);
                    }
                  }
                  ppsVar57 = ppsVar57 + 1;
                }
                if ((int)uVar41 < 3) {
                  psVar43 = psVar28->s;
                  if (bVar62) {
                    uVar36 = (ulong)(sVar20 * iVar19);
                    if (uVar41 == 1) {
                      for (uVar47 = 0; uVar47 < psVar43->img_x; uVar47 = uVar47 + 1) {
                        data_00->buffer_start[uVar47 + uVar36 + -0x38] =
                             (stbi_uc)((uint)coutput[2][uVar47] * 0x1d +
                                       (uint)coutput[1][uVar47] * 0x96 +
                                       (uint)coutput[0][uVar47] * 0x4d >> 8);
                      }
                    }
                    else {
                      for (uVar47 = 0; uVar47 < psVar43->img_x; uVar47 = uVar47 + 1) {
                        data_00->buffer_start[uVar47 * 2 + uVar36 + -0x38] =
                             (stbi_uc)((uint)coutput[2][uVar47] * 0x1d +
                                       (uint)coutput[1][uVar47] * 0x96 +
                                       (uint)coutput[0][uVar47] * 0x4d >> 8);
                        data_00->buffer_start[uVar47 * 2 + uVar36 + -0x37] = 0xff;
                      }
                    }
                  }
                  else if (psVar43->img_n == 4) {
                    if (psVar28->app14_color_transform == 2) {
                      psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar36 = 0; uVar36 < psVar43->img_x; uVar36 = uVar36 + 1) {
                        iVar27 = (coutput[0][uVar36] ^ 0xff) * (uint)coutput[3][uVar36];
                        psVar35[-1] = (char)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        *psVar35 = 0xff;
                        psVar35 = psVar35 + uVar41;
                      }
                    }
                    else {
                      if (psVar28->app14_color_transform != 0) goto LAB_0012b0a2;
                      psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar36 = 0; uVar36 < psVar43->img_x; uVar36 = uVar36 + 1) {
                        bVar12 = coutput[3][uVar36];
                        iVar27 = (uint)coutput[0][uVar36] * (uint)bVar12;
                        iVar50 = (uint)coutput[1][uVar36] * (uint)bVar12;
                        psVar35[-1] = (char)((((uint)coutput[2][uVar36] * (uint)bVar12 + 0x80 >> 8)
                                              + (uint)coutput[2][uVar36] * (uint)bVar12 + 0x80 >> 8)
                                             * 0x1d + (iVar50 + (iVar50 + 0x80U >> 8) + 0x80 >> 8) *
                                                      0x96 + (iVar27 + (iVar27 + 0x80U >> 8) + 0x80
                                                             >> 8) * 0x4d >> 8);
                        *psVar35 = 0xff;
                        psVar35 = psVar35 + uVar41;
                      }
                    }
                  }
                  else {
LAB_0012b0a2:
                    uVar36 = (ulong)(sVar20 * iVar19);
                    if (uVar41 == 1) {
                      for (uVar47 = 0; uVar47 < psVar43->img_x; uVar47 = uVar47 + 1) {
                        data_00->buffer_start[uVar47 + uVar36 + -0x38] = coutput[0][uVar47];
                      }
                    }
                    else {
                      for (uVar47 = 0; uVar47 < psVar43->img_x; uVar47 = uVar47 + 1) {
                        data_00->buffer_start[uVar47 * 2 + uVar36 + -0x38] = coutput[0][uVar47];
                        data_00->buffer_start[uVar47 * 2 + uVar36 + -0x37] = 0xff;
                      }
                    }
                  }
                }
                else {
                  psVar43 = psVar28->s;
                  if (psVar43->img_n == 3) {
                    if (bVar62) {
                      psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar36 = 0; uVar36 < psVar43->img_x; uVar36 = uVar36 + 1) {
                        psVar35[-3] = coutput[0][uVar36];
                        psVar35[-2] = coutput[1][uVar36];
                        psVar35[-1] = coutput[2][uVar36];
                        *psVar35 = 0xff;
                        psVar35 = psVar35 + uVar41;
                      }
                    }
                    else {
LAB_0012b0d8:
                      (*psVar28->YCbCr_to_RGB_kernel)
                                (data_00->buffer_start + ((ulong)(uVar51 * uVar41 * sVar20) - 0x38),
                                 coutput[0],coutput[1],coutput[2],psVar43->img_x,uVar41);
                    }
                  }
                  else if (psVar43->img_n == 4) {
                    if (psVar28->app14_color_transform == 2) {
                      (*psVar28->YCbCr_to_RGB_kernel)
                                (data_00->buffer_start + ((ulong)(uVar51 * uVar41 * sVar20) - 0x38),
                                 coutput[0],coutput[1],coutput[2],psVar43->img_x,uVar41);
                      psVar43 = psVar28->s;
                      psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x36);
                      for (uVar36 = 0; uVar36 < psVar43->img_x; uVar36 = uVar36 + 1) {
                        bVar12 = coutput[3][uVar36];
                        iVar27 = (psVar35[-2] ^ 0xff) * (uint)bVar12;
                        psVar35[-2] = (byte)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (psVar35[-1] ^ 0xff) * (uint)bVar12;
                        psVar35[-1] = (byte)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (*psVar35 ^ 0xff) * (uint)bVar12;
                        *psVar35 = (byte)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        psVar35 = psVar35 + uVar41;
                      }
                    }
                    else {
                      if (psVar28->app14_color_transform != 0) goto LAB_0012b0d8;
                      psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar36 = 0; uVar36 < psVar43->img_x; uVar36 = uVar36 + 1) {
                        bVar12 = coutput[3][uVar36];
                        iVar27 = (uint)coutput[0][uVar36] * (uint)bVar12;
                        psVar35[-3] = (char)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (uint)coutput[1][uVar36] * (uint)bVar12;
                        psVar35[-2] = (char)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        psVar35[-1] = (char)(((uint)coutput[2][uVar36] * (uint)bVar12 + 0x80 >> 8) +
                                             (uint)coutput[2][uVar36] * (uint)bVar12 + 0x80 >> 8);
                        *psVar35 = 0xff;
                        psVar35 = psVar35 + uVar41;
                      }
                    }
                  }
                  else {
                    psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                    for (uVar36 = 0; uVar36 < psVar43->img_x; uVar36 = uVar36 + 1) {
                      sVar14 = coutput[0][uVar36];
                      psVar35[-1] = sVar14;
                      psVar35[-2] = sVar14;
                      psVar35[-3] = sVar14;
                      *psVar35 = 0xff;
                      psVar35 = psVar35 + uVar41;
                    }
                  }
                }
                uVar51 = uVar51 + 1;
                psVar43 = psVar28->s;
                sVar20 = psVar43->img_y;
                iVar19 = iVar19 + uVar41;
              } while( true );
            }
            stbi__cleanup_jpeg(psVar28);
LAB_0012b283:
            stbi__g_failure_reason = "outofmem";
            goto LAB_0012a505;
          }
          sVar20 = psVar43->img_x;
          pvVar32 = malloc((ulong)(sVar20 + 3));
          *(void **)((long)&psVar28->img_comp[0].linebuf + lVar29 * 2) = pvVar32;
          if (pvVar32 == (void *)0x0) {
            stbi__cleanup_jpeg(psVar28);
            goto LAB_0012b283;
          }
          uVar36 = (long)psVar28->img_h_max /
                   (long)*(int *)((long)&psVar28->img_comp[0].h + lVar29 * 2);
          iVar19 = (int)uVar36;
          *(int *)((long)data + lVar29 + 0x18) = iVar19;
          iVar27 = psVar28->img_v_max / *(int *)((long)&psVar28->img_comp[0].v + lVar29 * 2);
          *(int *)((long)data + lVar29 + 0x1c) = iVar27;
          *(int *)((long)data + lVar29 + 0x24) = iVar27 >> 1;
          *(int *)((long)data + lVar29 + 0x20) =
               (int)((ulong)((sVar20 + iVar19) - 1) / (uVar36 & 0xffffffff));
          *(undefined4 *)((long)data + lVar29 + 0x28) = 0;
          uVar8 = *(undefined8 *)((long)&psVar28->img_comp[0].data + lVar29 * 2);
          *(undefined8 *)((long)data + lVar29 + 0x10) = uVar8;
          *(undefined8 *)((long)data + lVar29 + 8) = uVar8;
          if (iVar19 == 2) {
            pcVar33 = stbi__resample_row_h_2;
            if (iVar27 != 1) {
              if (iVar27 != 2) goto LAB_0012ac19;
              pcVar33 = psVar28->resample_row_hv_2_kernel;
            }
          }
          else if (iVar19 == 1) {
            pcVar33 = stbi__resample_row_generic;
            if (iVar27 == 2) {
              pcVar33 = stbi__resample_row_v_2;
            }
            if (iVar27 == 1) {
              pcVar33 = resample_row_1;
            }
          }
          else {
LAB_0012ac19:
            pcVar33 = stbi__resample_row_generic;
          }
          *(code **)((long)data + lVar29) = pcVar33;
          lVar29 = lVar29 + 0x30;
        } while( true );
      }
LAB_0012a4f8:
      stbi__cleanup_jpeg(psVar28);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0012a505:
    data_00 = (stbi__context *)0x0;
    goto LAB_0012a507;
  }
  iVar19 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar19 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    data._0_8_ = s;
    iVar19 = stbi__parse_png_file((stbi__png *)data,0,req_comp);
    uVar8 = data._0_8_;
    if (iVar19 == 0) {
      data_00 = (stbi__context *)0x0;
    }
    else {
      iVar19 = 8;
      if (8 < (int)data._32_4_) {
        iVar19 = data._32_4_;
      }
      ri->bits_per_channel = iVar19;
      if ((req_comp != 0) && (iVar19 = *(int *)(data._0_8_ + 0xc), iVar19 != req_comp)) {
        if ((int)data._32_4_ < 9) {
          data._24_8_ = stbi__convert_format
                                  ((uchar *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_,
                                   *(uint *)(data._0_8_ + 4));
        }
        else {
          data._24_8_ = stbi__convert_format16
                                  ((stbi__uint16 *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_,
                                   *(uint *)(data._0_8_ + 4));
        }
        *(int *)(uVar8 + 0xc) = req_comp;
        if ((stbi__context *)data._24_8_ == (stbi__context *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(int *)uVar8;
      *y = *(int *)(uVar8 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar8 + 8);
      }
      data_00 = (stbi__context *)data._24_8_;
      data._24_8_ = (void *)0x0;
    }
    free((void *)data._24_8_);
    free((void *)data._16_8_);
    psVar28 = (stbi__jpeg *)data._8_8_;
    goto LAB_0012a507;
  }
  sVar14 = stbi__get8(s);
  if ((sVar14 == 'B') && (sVar14 = stbi__get8(s), sVar14 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar20 = stbi__get32le(s);
    if (((sVar20 < 0x39) && ((0x100010000001000U >> ((ulong)sVar20 & 0x3f) & 1) != 0)) ||
       ((sVar20 == 0x7c || (sVar20 == 0x6c)))) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      coutput[3] = (stbi_uc *)CONCAT44(0xff,(uint)coutput[3]);
      pvVar32 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
      if (pvVar32 == (void *)0x0) {
        return (void *)0x0;
      }
      sVar20 = s->img_y;
      sVar24 = -sVar20;
      if (0 < (int)sVar20) {
        sVar24 = sVar20;
      }
      s->img_y = sVar24;
      uVar51 = (uint)coutput[3];
      iVar19 = (int)coutput[0];
      local_8948 = coutput[3]._4_4_;
      if ((int)coutput[1] == 0xc) {
        if ((int)coutput[0] < 0x18) {
          uVar41 = (int)(coutput[0]._4_4_ + -0x26) / 3;
        }
        else {
LAB_00129c8a:
          uVar41 = 0;
        }
      }
      else {
        if (0xf < (int)coutput[0]) goto LAB_00129c8a;
        uVar41 = (int)((coutput[0]._4_4_ - (int)coutput[1]) + -0xe) >> 2;
      }
      iVar27 = 4 - (uint)((uint)coutput[3] == 0);
      s->img_n = iVar27;
      if (2 < req_comp) {
        iVar27 = req_comp;
      }
      sVar25 = s->img_x;
      iVar50 = stbi__mad3sizes_valid(iVar27,sVar25,sVar24,0);
      if (iVar50 == 0) goto LAB_0012bb7e;
      puVar30 = (uchar *)stbi__malloc_mad3(iVar27,sVar25,sVar24,0);
      if (puVar30 == (uchar *)0x0) goto LAB_0012a76a;
      if (iVar19 < 0x10) {
        if (0x100 < (int)uVar41 || uVar41 == 0) {
          free(puVar30);
          stbi__g_failure_reason = "invalid";
          return (void *)0x0;
        }
        uVar59 = 0;
        uVar36 = 0;
        if (0 < (int)uVar41) {
          uVar36 = (ulong)uVar41;
        }
        for (; uVar36 != uVar59; uVar59 = uVar59 + 1) {
          sVar14 = stbi__get8(s);
          *(stbi_uc *)(data + uVar59 * 2 + 1) = sVar14;
          sVar14 = stbi__get8(s);
          *(stbi_uc *)((long)data + uVar59 * 4 + 1) = sVar14;
          sVar14 = stbi__get8(s);
          *(stbi_uc *)(data + uVar59 * 2) = sVar14;
          if ((int)coutput[1] != 0xc) {
            stbi__get8(s);
          }
          *(undefined1 *)((long)data + uVar59 * 4 + 3) = 0xff;
        }
        stbi__skip(s,(uVar41 * ((int)coutput[1] == 0xc | 0xfffffffc) - (int)coutput[1]) +
                     coutput[0]._4_4_ + -0xe);
        if (iVar19 == 1) {
          sVar25 = s->img_x;
          iVar19 = 0;
          uVar36 = 0;
LAB_0012b3e7:
          sVar24 = s->img_y;
          if (iVar19 < (int)sVar24) {
            iVar50 = 0;
            do {
              bVar12 = stbi__get8(s);
              sVar24 = s->img_x;
              iVar44 = 8;
              do {
                if ((int)sVar24 <= iVar50) {
LAB_0012b484:
                  uVar36 = uVar36 & 0xffffffff;
                  stbi__skip(s,-(sVar25 + 7 >> 3) & 3);
                  iVar19 = iVar19 + 1;
                  goto LAB_0012b3e7;
                }
                uVar59 = (ulong)((bVar12 >> (iVar44 - 1U & 0x1f) & 1) != 0);
                iVar45 = (int)uVar36;
                lVar29 = (long)iVar45;
                uVar36 = lVar29 + 3;
                puVar30[lVar29] = (uchar)data[uVar59 * 2];
                puVar30[lVar29 + 1] = *(uchar *)((long)data + uVar59 * 4 + 1);
                puVar30[lVar29 + 2] = (uchar)data[uVar59 * 2 + 1];
                if (iVar27 == 4) {
                  puVar30[lVar29 + 3] = 0xff;
                  uVar36 = (ulong)(iVar45 + 4);
                }
                if (sVar24 - 1 == iVar50) goto LAB_0012b484;
                iVar50 = iVar50 + 1;
                iVar45 = iVar44 + -1;
                bVar62 = 0 < iVar44;
                iVar44 = iVar45;
              } while (iVar45 != 0 && bVar62);
            } while( true );
          }
        }
        else {
          if (iVar19 == 8) {
            uVar51 = s->img_x;
          }
          else {
            if (iVar19 != 4) {
              free(puVar30);
              stbi__g_failure_reason = "bad bpp";
              return (void *)0x0;
            }
            uVar51 = s->img_x + 1 >> 1;
          }
          uVar36 = 0;
          for (iVar50 = 0; sVar24 = s->img_y, iVar50 < (int)sVar24; iVar50 = iVar50 + 1) {
            for (iVar44 = 0; iVar44 < (int)s->img_x; iVar44 = iVar44 + 2) {
              bVar12 = stbi__get8(s);
              uVar41 = (uint)(bVar12 >> 4);
              if (iVar19 != 4) {
                uVar41 = (uint)bVar12;
              }
              uVar59 = (ulong)uVar41;
              uVar41 = bVar12 & 0xf;
              if (iVar19 != 4) {
                uVar41 = 0;
              }
              lVar29 = (long)(int)uVar36;
              uVar47 = lVar29 + 3;
              puVar30[lVar29] = (uchar)data[uVar59 * 2];
              puVar30[lVar29 + 1] = *(uchar *)((long)data + uVar59 * 4 + 1);
              puVar30[lVar29 + 2] = (uchar)data[uVar59 * 2 + 1];
              if (iVar27 == 4) {
                puVar30[lVar29 + 3] = 0xff;
                uVar47 = (ulong)((int)uVar36 + 4);
              }
              if (iVar44 + 1U == s->img_x) {
                uVar36 = uVar47 & 0xffffffff;
                break;
              }
              if (iVar19 == 8) {
                bVar12 = stbi__get8(s);
                uVar41 = (uint)bVar12;
              }
              lVar29 = (long)(int)uVar47;
              uVar36 = lVar29 + 3;
              uVar59 = (ulong)uVar41;
              puVar30[lVar29] = (uchar)data[uVar59 * 2];
              puVar30[lVar29 + 1] = *(uchar *)((long)data + uVar59 * 4 + 1);
              puVar30[lVar29 + 2] = (uchar)data[uVar59 * 2 + 1];
              if (iVar27 == 4) {
                puVar30[lVar29 + 3] = 0xff;
                uVar36 = (ulong)((int)uVar47 + 4);
              }
            }
            stbi__skip(s,-uVar51 & 3);
          }
        }
        goto LAB_0012b49f;
      }
      stbi__skip(s,(coutput[0]._4_4_ - (int)coutput[1]) + -0xe);
      if (iVar19 == 0x10) {
        local_88ec = s->img_x * 2 & 2;
LAB_0012a82a:
        if (coutput[2]._4_4_ == 0 || ((uint)coutput[2] == 0 || coutput[1]._4_4_ == 0)) {
          free(puVar30);
          stbi__g_failure_reason = "bad masks";
          return (void *)0x0;
        }
        iVar50 = stbi__high_bit(coutput[1]._4_4_);
        iVar50 = iVar50 + -7;
        iVar44 = stbi__bitcount(coutput[1]._4_4_);
        iVar45 = stbi__high_bit((uint)coutput[2]);
        iVar45 = iVar45 + -7;
        iVar21 = stbi__bitcount((uint)coutput[2]);
        iVar22 = stbi__high_bit(coutput[2]._4_4_);
        iVar22 = iVar22 + -7;
        local_88b0 = stbi__bitcount(coutput[2]._4_4_);
        local_88b4 = stbi__high_bit(uVar51);
        local_88b4 = local_88b4 + -7;
        local_88b8 = stbi__bitcount(uVar51);
        bVar11 = true;
        bVar62 = false;
      }
      else {
        if (iVar19 == 0x20) {
          local_88ec = 0;
          if (uVar51 != 0xff000000 ||
              (coutput[1]._4_4_ != 0xff0000 ||
              ((uint)coutput[2] != 0xff00 || coutput[2]._4_4_ != 0xff))) goto LAB_0012a82a;
          bVar62 = true;
        }
        else {
          local_88ec = 0;
          if (iVar19 != 0x18) goto LAB_0012a82a;
          local_88ec = s->img_x & 3;
          bVar62 = false;
        }
        bVar11 = false;
        iVar50 = 0;
        iVar45 = 0;
        iVar22 = 0;
        local_88b4 = 0;
        iVar44 = 0;
        iVar21 = 0;
        local_88b0 = 0;
        local_88b8 = 0;
      }
      uVar36 = 0;
      for (iVar23 = 0; sVar24 = s->img_y, iVar23 < (int)sVar24; iVar23 = iVar23 + 1) {
        if (bVar11) {
          for (iVar55 = 0; iVar55 < (int)s->img_x; iVar55 = iVar55 + 1) {
            if (iVar19 == 0x10) {
              uVar41 = stbi__get16le(s);
            }
            else {
              uVar41 = stbi__get32le(s);
            }
            iVar26 = stbi__shiftsigned(uVar41 & coutput[1]._4_4_,iVar50,iVar44);
            lVar29 = (long)(int)uVar36;
            puVar30[lVar29] = (uchar)iVar26;
            iVar26 = stbi__shiftsigned(uVar41 & (uint)coutput[2],iVar45,iVar21);
            puVar30[lVar29 + 1] = (uchar)iVar26;
            iVar26 = stbi__shiftsigned(uVar41 & coutput[2]._4_4_,iVar22,local_88b0);
            puVar30[lVar29 + 2] = (uchar)iVar26;
            if (uVar51 == 0) {
              uVar41 = 0xff;
            }
            else {
              uVar41 = stbi__shiftsigned(uVar41 & uVar51,local_88b4,local_88b8);
            }
            uVar59 = lVar29 + 3;
            if (iVar27 == 4) {
              puVar30[lVar29 + 3] = (uchar)uVar41;
              uVar59 = (ulong)((int)uVar36 + 4);
            }
            local_8948 = local_8948 | uVar41;
            uVar36 = uVar59 & 0xffffffff;
          }
        }
        else {
          for (iVar55 = 0; iVar55 < (int)s->img_x; iVar55 = iVar55 + 1) {
            sVar14 = stbi__get8(s);
            lVar29 = (long)(int)uVar36;
            puVar30[lVar29 + 2] = sVar14;
            sVar14 = stbi__get8(s);
            puVar30[lVar29 + 1] = sVar14;
            sVar14 = stbi__get8(s);
            puVar30[lVar29] = sVar14;
            bVar12 = 0xff;
            if (bVar62) {
              bVar12 = stbi__get8(s);
            }
            uVar59 = lVar29 + 3;
            if (iVar27 == 4) {
              puVar30[lVar29 + 3] = bVar12;
              uVar59 = (ulong)((int)uVar36 + 4);
            }
            local_8948 = local_8948 | bVar12;
            uVar36 = uVar59 & 0xffffffff;
          }
        }
        stbi__skip(s,local_88ec);
      }
LAB_0012b49f:
      if ((iVar27 == 4) && (local_8948 == 0)) {
        for (uVar51 = s->img_x * sVar24 * 4 - 1; -1 < (int)uVar51; uVar51 = uVar51 - 4) {
          puVar30[uVar51] = 0xff;
        }
      }
      if (0 < (int)sVar20) {
        iVar19 = (int)sVar24 >> 1;
        if ((int)sVar24 >> 1 < 1) {
          iVar19 = 0;
        }
        iVar50 = (sVar24 - 1) * iVar27;
        iVar45 = 0;
        for (iVar44 = 0; iVar44 != iVar19; iVar44 = iVar44 + 1) {
          sVar20 = s->img_x;
          uVar36 = (ulong)(sVar20 * iVar27);
          if ((int)(sVar20 * iVar27) < 1) {
            uVar36 = 0;
          }
          for (uVar59 = 0; uVar36 != uVar59; uVar59 = uVar59 + 1) {
            uVar4 = puVar30[uVar59 + sVar20 * iVar45];
            puVar30[uVar59 + sVar20 * iVar45] = puVar30[uVar59 + sVar20 * iVar50];
            puVar30[uVar59 + sVar20 * iVar50] = uVar4;
          }
          iVar50 = iVar50 - iVar27;
          iVar45 = iVar45 + iVar27;
        }
      }
      uVar51 = s->img_x;
      if ((req_comp != 0) && (iVar27 != req_comp)) {
        puVar30 = stbi__convert_format(puVar30,iVar27,req_comp,uVar51,sVar24);
        if (puVar30 == (uchar *)0x0) {
          return (void *)0x0;
        }
        uVar51 = s->img_x;
      }
      *x = uVar51;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return puVar30;
      }
      return puVar30;
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar19 = stbi__gif_test(s);
  if (iVar19 != 0) {
    memset((stbi__gif *)data,0,0x8870);
    data_00 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)data,comp,0,psVar35);
    if (data_00 == (stbi__context *)0x0 || data_00 == s) {
      free((void *)data._8_8_);
      data_00 = (stbi__context *)0x0;
    }
    else {
      *x = data._0_4_;
      *y = data._4_4_;
      if ((req_comp & 0xfffffffbU) != 0) {
        data_00 = (stbi__context *)
                  stbi__convert_format((uchar *)data_00,4,req_comp,data._0_4_,data._4_4_);
      }
    }
    free((void *)data._24_8_);
    psVar28 = (stbi__jpeg *)data._16_8_;
    goto LAB_0012a507;
  }
  sVar20 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar20 == 0x38425053) {
    sVar20 = stbi__get32be(s);
    if (sVar20 != 0x38425053) {
      stbi__g_failure_reason = "not PSD";
      return (void *)0x0;
    }
    iVar19 = stbi__get16be(s);
    if (iVar19 != 1) {
      stbi__g_failure_reason = "wrong version";
      return (void *)0x0;
    }
    stbi__skip(s,6);
    uVar51 = stbi__get16be(s);
    if (0x10 < uVar51) {
      stbi__g_failure_reason = "wrong channel count";
      return (void *)0x0;
    }
    sVar20 = stbi__get32be(s);
    sVar24 = stbi__get32be(s);
    iVar19 = stbi__get16be(s);
    if ((iVar19 != 8) && (iVar19 != 0x10)) {
      stbi__g_failure_reason = "unsupported bit depth";
      return (void *)0x0;
    }
    iVar27 = stbi__get16be(s);
    if (iVar27 != 3) {
      stbi__g_failure_reason = "wrong color format";
      return (void *)0x0;
    }
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    uVar41 = stbi__get16be(s);
    if (1 < uVar41) {
      stbi__g_failure_reason = "bad compression";
      return (void *)0x0;
    }
    iVar27 = stbi__mad3sizes_valid(4,sVar24,sVar20,0);
    if (iVar27 == 0) goto LAB_0012bb7e;
    if (((bpc == 0x10) && (iVar19 == 0x10)) && (uVar41 == 0)) {
      data_01 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar24,sVar20,0);
      ri->bits_per_channel = 0x10;
    }
    else {
      data_01 = (stbi__uint16 *)malloc((long)(int)(sVar20 * sVar24 * 4));
    }
    if (data_01 != (stbi__uint16 *)0x0) {
      uVar58 = sVar24 * sVar20;
      if (uVar41 == 0) {
        uVar36 = 0;
        psVar61 = data_01;
        local_8978 = data_01;
        uVar41 = 0;
        if (0 < (int)uVar58) {
          uVar41 = uVar58;
        }
        for (; uVar36 != 4; uVar36 = uVar36 + 1) {
          if (uVar36 < uVar51) {
            if (ri->bits_per_channel == 0x10) {
              for (lVar29 = 0; uVar41 != (uint)lVar29; lVar29 = lVar29 + 1) {
                iVar27 = stbi__get16be(s);
                local_8978[lVar29 * 4] = (stbi__uint16)iVar27;
              }
            }
            else {
              lVar29 = 0;
              if (iVar19 == 0x10) {
                for (; uVar41 != (uint)lVar29; lVar29 = lVar29 + 1) {
                  iVar27 = stbi__get16be(s);
                  *(char *)(psVar61 + lVar29 * 2) = (char)((uint)iVar27 >> 8);
                }
              }
              else {
                for (; uVar41 != (uint)lVar29; lVar29 = lVar29 + 1) {
                  sVar14 = stbi__get8(s);
                  *(stbi_uc *)(psVar61 + lVar29 * 2) = sVar14;
                }
              }
            }
          }
          else if (iVar19 == 0x10 && bpc == 0x10) {
            for (lVar29 = 0; uVar41 != (uint)lVar29; lVar29 = lVar29 + 1) {
              local_8978[lVar29 * 4] = -(ushort)(uVar36 == 3);
            }
          }
          else {
            for (lVar29 = 0; uVar41 != (uint)lVar29; lVar29 = lVar29 + 1) {
              *(char *)(psVar61 + lVar29 * 2) = -(uVar36 == 3);
            }
          }
          psVar61 = (stbi__uint16 *)((long)psVar61 + 1);
          local_8978 = local_8978 + 1;
        }
      }
      else {
        stbi__skip(s,sVar20 * uVar51 * 2);
        uVar36 = 0;
        psVar61 = data_01;
        uVar41 = 0;
        if (0 < (int)uVar58) {
          uVar41 = uVar58;
        }
        for (; uVar36 != 4; uVar36 = uVar36 + 1) {
          if (uVar36 < uVar51) {
            psVar35 = (stbi_uc *)((long)data_01 + uVar36);
            iVar19 = 0;
            do {
              uVar56 = uVar58 - iVar19;
              do {
                if ((int)uVar56 < 1) goto LAB_0012b73d;
                bVar12 = stbi__get8(s);
              } while (bVar12 == 0x80);
              uVar52 = (uint)bVar12;
              if ((char)bVar12 < '\0') {
                uVar53 = 0x101 - uVar52;
                if (uVar56 < uVar53) goto LAB_0012bcaf;
                sVar14 = stbi__get8(s);
                for (iVar27 = uVar52 - 0x101; iVar27 != 0; iVar27 = iVar27 + 1) {
                  *psVar35 = sVar14;
                  psVar35 = psVar35 + 4;
                }
              }
              else {
                if (uVar56 <= bVar12) {
LAB_0012bcaf:
                  free(data_01);
                  stbi__g_failure_reason = "corrupt";
                  return (void *)0x0;
                }
                uVar53 = uVar52 + 1;
                uVar56 = uVar53;
                while (bVar62 = uVar56 != 0, uVar56 = uVar56 - 1, bVar62) {
                  sVar14 = stbi__get8(s);
                  *psVar35 = sVar14;
                  psVar35 = psVar35 + 4;
                }
              }
              iVar19 = iVar19 + uVar53;
            } while( true );
          }
          for (lVar29 = 0; uVar41 != (uint)lVar29; lVar29 = lVar29 + 1) {
            *(char *)(psVar61 + lVar29 * 2) = -(uVar36 == 3);
          }
LAB_0012b73d:
          psVar61 = (stbi__uint16 *)((long)psVar61 + 1);
        }
      }
      if (3 < uVar51) {
        uVar36 = 0;
        if (0 < (int)uVar58) {
          uVar36 = (ulong)uVar58;
        }
        if (ri->bits_per_channel == 0x10) {
          for (uVar59 = 0; uVar36 != uVar59; uVar59 = uVar59 + 1) {
            uVar7 = data_01[uVar59 * 4 + 3];
            if ((uVar7 != 0) && (uVar7 != 0xffff)) {
              fVar64 = 1.0 / ((float)uVar7 / 65535.0);
              fVar63 = (1.0 - fVar64) * 65535.0;
              auVar65._0_4_ =
                   (int)(fVar63 + fVar64 * (float)(*(uint *)(data_01 + uVar59 * 4) & 0xffff));
              auVar65._4_4_ =
                   (int)(fVar63 + fVar64 * (float)(*(uint *)(data_01 + uVar59 * 4) >> 0x10));
              auVar65._8_4_ = (int)(fVar63 + fVar64 * 0.0);
              auVar65._12_4_ = (int)(fVar63 + fVar64 * 0.0);
              auVar65 = pshuflw(auVar65,auVar65,0xe8);
              *(int *)(data_01 + uVar59 * 4) = auVar65._0_4_;
              data_01[uVar59 * 4 + 2] =
                   (stbi__uint16)(int)((float)data_01[uVar59 * 4 + 2] * fVar64 + fVar63);
            }
          }
        }
        else {
          for (uVar59 = 0; uVar36 != uVar59; uVar59 = uVar59 + 1) {
            bVar12 = *(byte *)((long)data_01 + uVar59 * 4 + 3);
            if ((bVar12 != 0) && (bVar12 != 0xff)) {
              fVar64 = 1.0 / ((float)bVar12 / 255.0);
              fVar63 = (1.0 - fVar64) * 255.0;
              *(char *)(data_01 + uVar59 * 2) =
                   (char)(int)((float)(byte)data_01[uVar59 * 2] * fVar64 + fVar63);
              *(char *)((long)data_01 + uVar59 * 4 + 1) =
                   (char)(int)((float)*(byte *)((long)data_01 + uVar59 * 4 + 1) * fVar64 + fVar63);
              *(char *)(data_01 + uVar59 * 2 + 1) =
                   (char)(int)((float)(byte)data_01[uVar59 * 2 + 1] * fVar64 + fVar63);
            }
          }
        }
      }
      if ((req_comp & 0xfffffffbU) != 0) {
        if (ri->bits_per_channel == 0x10) {
          data_01 = stbi__convert_format16(data_01,4,req_comp,sVar24,sVar20);
        }
        else {
          data_01 = (stbi__uint16 *)stbi__convert_format((uchar *)data_01,4,req_comp,sVar24,sVar20);
        }
        if (data_01 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      *y = sVar20;
      *x = sVar24;
      return data_01;
    }
    goto LAB_0012a76a;
  }
  iVar19 = stbi__pic_is4(s,anon_var_dwarf_2c8a4);
  if (iVar19 == 0) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
  }
  else {
    iVar19 = 0x54;
    while (bVar62 = iVar19 != 0, iVar19 = iVar19 + -1, bVar62) {
      stbi__get8(s);
    }
    iVar19 = stbi__pic_is4(s,"PICT");
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar19 != 0) {
      iVar19 = 0x5c;
      while (bVar62 = iVar19 != 0, iVar19 = iVar19 + -1, bVar62) {
        stbi__get8(s);
      }
      uVar51 = stbi__get16be(s);
      uVar41 = stbi__get16be(s);
      iVar19 = stbi__at_eof(s);
      if (iVar19 != 0) {
        stbi__g_failure_reason = "bad file";
        return (void *)0x0;
      }
      bVar12 = 0;
      iVar19 = stbi__mad3sizes_valid(uVar51,uVar41,4,0);
      if (iVar19 == 0) goto LAB_0012bb7e;
      stbi__get32be(s);
      stbi__get16be(s);
      stbi__get16be(s);
      psVar28 = (stbi__jpeg *)stbi__malloc_mad3(uVar51,uVar41,4,0);
      memset(psVar28,0xff,(ulong)(uVar51 * 4 * uVar41));
      pbVar54 = (byte *)(data + 1);
      lVar29 = 0;
      do {
        if (lVar29 == 10) {
LAB_0012a756:
          stbi__g_failure_reason = "bad format";
          goto LAB_0012b845;
        }
        sVar14 = stbi__get8(s);
        bVar13 = stbi__get8(s);
        pbVar54[-2] = bVar13;
        bVar16 = stbi__get8(s);
        pbVar54[-1] = bVar16;
        bVar16 = stbi__get8(s);
        *pbVar54 = bVar16;
        iVar19 = stbi__at_eof(s);
        if (iVar19 != 0) {
          stbi__g_failure_reason = "bad file";
          goto LAB_0012b845;
        }
        if (bVar13 != 8) goto LAB_0012a756;
        bVar12 = bVar12 | bVar16;
        pbVar54 = pbVar54 + 3;
        lVar29 = lVar29 + 1;
      } while (sVar14 != '\0');
      uVar58 = 4 - ((bVar12 & 0x10) == 0);
      if (comp != (int *)0x0) {
        *comp = uVar58;
      }
      for (uVar36 = 0; uVar36 != uVar41; uVar36 = uVar36 + 1) {
        psVar35 = psVar28->huff_dc[0].fast + (long)(int)(uVar51 * 4 * (int)uVar36) + -8;
        for (lVar46 = 0; lVar29 != lVar46; lVar46 = lVar46 + 1) {
          lVar9 = lVar46 * 3;
          cVar3 = *(char *)((long)data + lVar9 + 1);
          psVar60 = psVar35;
          uVar56 = uVar51;
          if (cVar3 != '\0') {
            if (cVar3 == '\x01') {
              for (; 0 < (int)uVar56; uVar56 = uVar56 - (uVar52 & 0xff)) {
                bVar12 = stbi__get8(s);
                iVar19 = stbi__at_eof(s);
                if (iVar19 != 0) goto LAB_0012b824;
                psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),(stbi_uc *)coutput
                                       );
                if (psVar31 == (stbi_uc *)0x0) goto LAB_0012b832;
                uVar52 = (uint)bVar12;
                if (uVar56 < bVar12) {
                  uVar52 = uVar56;
                }
                uVar53 = uVar52 & 0xff;
                while (bVar62 = uVar53 != 0, uVar53 = uVar53 - 1, bVar62) {
                  stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar60,(stbi_uc *)coutput);
                  psVar60 = psVar60 + 4;
                }
              }
              goto LAB_0012a4ba;
            }
            if (cVar3 == '\x02') {
              for (; 0 < (int)uVar56; uVar56 = uVar56 - iVar19) {
                bVar12 = stbi__get8(s);
                iVar19 = stbi__at_eof(s);
                if (iVar19 != 0) goto LAB_0012b824;
                uVar52 = (uint)bVar12;
                if ((char)bVar12 < '\0') {
                  if (uVar52 == 0x80) {
                    iVar19 = stbi__get16be(s);
                  }
                  else {
                    iVar19 = uVar52 - 0x7f;
                  }
                  if ((int)uVar56 < iVar19) goto LAB_0012b824;
                  psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),
                                          (stbi_uc *)coutput);
                  iVar27 = iVar19;
                  if (psVar31 == (stbi_uc *)0x0) goto LAB_0012b832;
                  while (iVar27 != 0) {
                    stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar60,(stbi_uc *)coutput
                                 );
                    psVar60 = psVar60 + 4;
                    iVar27 = iVar27 + -1;
                  }
                }
                else {
                  iVar19 = bVar12 + 1;
                  iVar27 = iVar19;
                  if (uVar56 <= uVar52) goto LAB_0012b824;
                  while (bVar62 = iVar27 != 0, iVar27 = iVar27 + -1, bVar62) {
                    psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar60);
                    if (psVar31 == (stbi_uc *)0x0) goto LAB_0012b832;
                    psVar60 = psVar60 + 4;
                  }
                }
              }
              goto LAB_0012a4ba;
            }
            stbi__g_failure_reason = "bad format";
            goto LAB_0012b832;
          }
          while (bVar62 = uVar56 != 0, uVar56 = uVar56 - 1, bVar62) {
            psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar60);
            if (psVar31 == (stbi_uc *)0x0) goto LAB_0012b832;
            psVar60 = psVar60 + 4;
          }
LAB_0012a4ba:
        }
      }
      s = (stbi__context *)(ulong)uVar58;
      if (psVar28 == (stbi__jpeg *)0x0) goto LAB_0012b845;
      goto LAB_0012b84c;
    }
  }
  sVar14 = stbi__get8(s);
  sVar15 = stbi__get8(s);
  if ((sVar14 == 'P') && (0xfd < (byte)(sVar15 - 0x37))) {
    iVar19 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
    if (iVar19 == 0) {
      return (void *)0x0;
    }
    *x = s->img_x;
    sVar20 = s->img_y;
    *y = sVar20;
    iVar19 = s->img_n;
    if (comp != (int *)0x0) {
      *comp = iVar19;
      sVar20 = s->img_y;
    }
    sVar24 = s->img_x;
    iVar27 = stbi__mad3sizes_valid(iVar19,sVar24,sVar20,0);
    if (iVar27 == 0) goto LAB_0012bb7e;
    puVar30 = (uchar *)stbi__malloc_mad3(iVar19,sVar24,sVar20,0);
    if (puVar30 != (uchar *)0x0) {
      stbi__getn(s,puVar30,sVar20 * iVar19 * sVar24);
      if (req_comp == 0) {
        return puVar30;
      }
      iVar19 = s->img_n;
      if (iVar19 != req_comp) {
        puVar30 = stbi__convert_format(puVar30,iVar19,req_comp,s->img_x,s->img_y);
        return puVar30;
      }
      return puVar30;
    }
    goto LAB_0012a76a;
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar19 = stbi__hdr_test(s);
  if (iVar19 != 0) {
    psVar28 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
    if (req_comp == 0) {
      req_comp = *comp;
    }
    if (psVar28 == (stbi__jpeg *)0x0) {
      return (void *)0x0;
    }
    iVar19 = *x;
    iVar27 = *y;
    data_00 = (stbi__context *)stbi__malloc_mad3(iVar19,iVar27,req_comp,0);
    if (data_00 != (stbi__context *)0x0) {
      uVar41 = (req_comp + (req_comp & 1U)) - 1;
      uVar51 = iVar27 * iVar19;
      uVar36 = (ulong)uVar41;
      if ((int)uVar41 < 1) {
        uVar36 = 0;
      }
      lVar29 = (long)req_comp;
      uVar59 = (ulong)uVar51;
      if ((int)uVar51 < 1) {
        uVar59 = 0;
      }
      psVar43 = data_00;
      psVar49 = psVar28;
      for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
        for (uVar42 = 0; uVar36 != uVar42; uVar42 = uVar42 + 1) {
          fVar63 = powf(*(float *)(psVar49->huff_dc[0].fast + uVar42 * 4 + -8) * stbi__h2l_scale_i,
                        stbi__h2l_gamma_i);
          fVar64 = fVar63 * 255.0 + 0.5;
          fVar63 = 0.0;
          if (0.0 <= fVar64) {
            fVar63 = fVar64;
          }
          fVar64 = 255.0;
          if (fVar63 <= 255.0) {
            fVar64 = fVar63;
          }
          psVar43->buffer_start[uVar42 - 0x38] = (stbi_uc)(int)fVar64;
        }
        if ((int)uVar36 < req_comp) {
          lVar46 = uVar47 * lVar29 + uVar36;
          fVar64 = *(float *)(psVar28->huff_dc[0].fast + lVar46 * 4 + -8) * 255.0 + 0.5;
          fVar63 = 0.0;
          if (0.0 <= fVar64) {
            fVar63 = fVar64;
          }
          fVar64 = 255.0;
          if (fVar63 <= 255.0) {
            fVar64 = fVar63;
          }
          data_00->buffer_start[lVar46 + -0x38] = (stbi_uc)(int)fVar64;
        }
        psVar43 = (stbi__context *)(psVar43->buffer_start + lVar29 + -0x38);
        psVar49 = (stbi__jpeg *)(psVar49->huff_dc[0].fast + lVar29 * 4 + -8);
      }
LAB_0012a507:
      free(psVar28);
      return data_00;
    }
LAB_0012a765:
    free(psVar28);
LAB_0012a76a:
    stbi__g_failure_reason = "outofmem";
    return (void *)0x0;
  }
  stbi__get8(s);
  bVar12 = stbi__get8(s);
  if (bVar12 < 2) {
    bVar13 = stbi__get8(s);
    if (bVar12 == 1) {
      if ((bVar13 & 0xf7) == 1) {
        iVar19 = 4;
        stbi__skip(s,4);
        bVar13 = stbi__get8(s);
        if ((bVar13 < 0x21) && ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) != 0))
        goto LAB_0012aa87;
      }
    }
    else if ((bVar13 & 0xf6) == 2) {
      iVar19 = 9;
LAB_0012aa87:
      stbi__skip(s,iVar19);
      iVar19 = stbi__get16le(s);
      if ((iVar19 != 0) && (iVar19 = stbi__get16le(s), iVar19 != 0)) {
        bVar13 = stbi__get8(s);
        if (bVar12 == 1) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if ((bVar13 - 8 & 0xf7) != 0) goto LAB_0012a5df;
        }
        else {
          if ((0x20 < bVar13) || ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) == 0))
          goto LAB_0012a5cf;
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
        }
        bVar13 = stbi__get8(s);
        sVar14 = stbi__get8(s);
        bVar16 = stbi__get8(s);
        iVar19 = stbi__get16le(s);
        uVar56 = stbi__get16le(s);
        bVar12 = stbi__get8(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar51 = stbi__get16le(s);
        uVar41 = stbi__get16le(s);
        bVar17 = stbi__get8(s);
        data._0_8_ = (ulong)(uint)data._4_4_ << 0x20;
        bVar18 = stbi__get8(s);
        coutput[0] = (stbi_uc *)((ulong)coutput[0]._4_4_ << 0x20);
        if (sVar14 == '\0') {
          uVar58 = bVar16 - 8;
          if (bVar16 < 8) {
            uVar58 = (uint)bVar16;
          }
          uVar58 = (uint)(uVar58 == 3);
          bVar12 = bVar17;
        }
        else {
          uVar58 = 0;
        }
        uVar58 = stbi__tga_get_comp((uint)bVar12,uVar58,(int *)data);
        if (uVar58 == 0) {
          stbi__g_failure_reason = "bad format";
          return (void *)0x0;
        }
        *x = uVar51;
        *y = uVar41;
        if (comp != (int *)0x0) {
          *comp = uVar58;
        }
        iVar27 = stbi__mad3sizes_valid(uVar51,uVar41,uVar58,0);
        if (iVar27 == 0) {
LAB_0012bb7e:
          stbi__g_failure_reason = "too large";
          return (void *)0x0;
        }
        psVar28 = (stbi__jpeg *)stbi__malloc_mad3(uVar51,uVar41,uVar58,0);
        if (psVar28 == (stbi__jpeg *)0x0) goto LAB_0012a76a;
        stbi__skip(s,(uint)bVar13);
        uVar36 = (ulong)uVar58;
        if (((sVar14 == '\0') && (bVar16 < 8)) && (data._0_4_ == 0)) {
          uVar52 = 0;
          uVar56 = uVar41;
          while (uVar56 = uVar56 - 1, uVar56 != 0xffffffff) {
            uVar53 = uVar52;
            if ((bVar18 >> 5 & 1) == 0) {
              uVar53 = uVar56;
            }
            stbi__getn(s,psVar28->huff_dc[0].fast + (long)(int)(uVar53 * uVar58 * uVar51) + -8,
                       uVar58 * uVar51);
            uVar52 = uVar52 + 1;
          }
        }
        else {
          if (sVar14 == '\0') {
            local_8958 = (stbi_uc *)0x0;
          }
          else {
            stbi__skip(s,iVar19);
            local_8958 = (stbi_uc *)stbi__malloc_mad2(uVar56,uVar58,0);
            if (local_8958 == (stbi_uc *)0x0) goto LAB_0012a765;
            if (data._0_4_ == 0) {
              iVar19 = stbi__getn(s,local_8958,uVar58 * uVar56);
              if (iVar19 == 0) {
                free(psVar28);
                free(local_8958);
                stbi__g_failure_reason = "bad palette";
                return (void *)0x0;
              }
            }
            else {
              if (uVar58 != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/stb_image.h"
                              ,0x15e0,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              for (lVar29 = 0; uVar56 * 3 != (int)lVar29; lVar29 = lVar29 + 3) {
                stbi__tga_read_rgb16(s,local_8958 + lVar29);
              }
            }
          }
          bVar62 = true;
          iVar19 = 0;
          uVar52 = 0;
          psVar49 = psVar28;
          for (uVar59 = 0; uVar59 != uVar41 * uVar51; uVar59 = uVar59 + 1) {
            if (bVar16 < 8) {
LAB_0012bde5:
              if (sVar14 == '\0') {
                if (data._0_4_ == 0) {
                  for (uVar47 = 0; uVar36 != uVar47; uVar47 = uVar47 + 1) {
                    sVar15 = stbi__get8(s);
                    *(stbi_uc *)((long)coutput + uVar47) = sVar15;
                  }
                }
                else {
                  if (uVar58 != 3) {
                    __assert_fail("tga_comp == STBI_rgb",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/stb_image.h"
                                  ,0x1611,
                                  "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                 );
                  }
                  stbi__tga_read_rgb16(s,(stbi_uc *)coutput);
                }
              }
              else {
                if (bVar17 == 8) {
                  bVar12 = stbi__get8(s);
                  uVar53 = (uint)bVar12;
                }
                else {
                  uVar53 = stbi__get16le(s);
                }
                if (uVar56 <= uVar53) {
                  uVar53 = 0;
                }
                for (uVar47 = 0; uVar36 != uVar47; uVar47 = uVar47 + 1) {
                  *(stbi_uc *)((long)coutput + uVar47) = local_8958[uVar47 + uVar53 * uVar58];
                }
              }
            }
            else {
              if (iVar19 == 0) {
                bVar12 = stbi__get8(s);
                iVar19 = (bVar12 & 0x7f) + 1;
                uVar52 = (uint)(bVar12 >> 7);
                goto LAB_0012bde5;
              }
              if (uVar52 == 0 || bVar62) {
                uVar52 = (uint)(uVar52 != 0);
                goto LAB_0012bde5;
              }
              uVar52 = 1;
            }
            for (uVar47 = 0; uVar36 != uVar47; uVar47 = uVar47 + 1) {
              psVar49->huff_dc[0].fast[uVar47 - 8] = *(stbi_uc *)((long)coutput + uVar47);
            }
            iVar19 = iVar19 + -1;
            psVar49 = (stbi__jpeg *)(psVar49->huff_dc[0].fast + (uVar36 - 8));
            bVar62 = false;
          }
          if ((bVar18 >> 5 & 1) == 0) {
            iVar19 = uVar58 * uVar51;
            iVar27 = (uVar41 - 1) * iVar19;
            uVar56 = 0;
            for (uVar52 = 0; uVar52 != uVar41 + 1 >> 1; uVar52 = uVar52 + 1) {
              psVar49 = psVar28;
              for (iVar50 = iVar19; 0 < iVar50; iVar50 = iVar50 + -1) {
                sVar14 = psVar49->huff_dc[0].fast[(ulong)uVar56 - 8];
                psVar49->huff_dc[0].fast[(ulong)uVar56 - 8] =
                     psVar49->huff_dc[0].fast[(long)iVar27 + -8];
                psVar49->huff_dc[0].fast[(long)iVar27 + -8] = sVar14;
                psVar49 = (stbi__jpeg *)((long)&psVar49->s + 1);
              }
              uVar56 = uVar56 + iVar19;
              iVar27 = iVar27 - iVar19;
            }
          }
          free(local_8958);
        }
        if ((2 < uVar58) && (data._0_4_ == 0)) {
          iVar19 = uVar41 * uVar51;
          puVar38 = (undefined1 *)((long)&psVar28->s + 2);
          while (bVar62 = iVar19 != 0, iVar19 = iVar19 + -1, bVar62) {
            uVar5 = puVar38[-2];
            puVar38[-2] = *puVar38;
            *puVar38 = uVar5;
            puVar38 = puVar38 + uVar36;
          }
        }
        if (req_comp == 0) {
          return psVar28;
        }
        if (uVar58 == req_comp) {
          return psVar28;
        }
LAB_0012b88c:
        puVar30 = stbi__convert_format((uchar *)psVar28,uVar58,req_comp,uVar51,uVar41);
        return puVar30;
      }
    }
  }
LAB_0012a5cf:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
LAB_0012a5df:
  stbi__g_failure_reason = "unknown image type";
  return (void *)0x0;
LAB_00129e5e:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_0012a4f8;
LAB_00128e08:
  bVar12 = stbi__get_marker(psVar28);
  goto LAB_00128da5;
LAB_0012b824:
  stbi__g_failure_reason = "bad file";
LAB_0012b832:
  s = (stbi__context *)(ulong)uVar58;
LAB_0012b845:
  uVar58 = (uint)s;
  free(psVar28);
  psVar28 = (stbi__jpeg *)0x0;
LAB_0012b84c:
  *x = uVar51;
  *y = uVar41;
  bVar62 = req_comp != 0;
  if (bVar62) {
    uVar58 = req_comp;
  }
  req_comp = uVar58;
  if (!bVar62 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar58 = 4;
  goto LAB_0012b88c;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}